

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

_Bool process_pref_file_named(char *path,_Bool quiet,_Bool user)

{
  _Bool _Var1;
  parser_error pVar2;
  ang_file *f;
  parser *p;
  void *pvVar3;
  long lVar4;
  parser_state s;
  char line [1024];
  parser_state local_450;
  char local_438 [1032];
  
  f = file_open(path,MODE_READ,0xffffffff);
  if (f == (ang_file *)0x0) {
    if (quiet) {
      _Var1 = false;
    }
    else {
      _Var1 = false;
      msg("Cannot open \'%s\'.",path);
    }
  }
  else {
    p = init_parse_prefs(user);
    do {
      _Var1 = file_getl(f,local_438,0x400);
      if (!_Var1) goto LAB_001e20c0;
      pVar2 = parser_parse(p,local_438);
    } while (pVar2 == PARSE_ERROR_NONE);
    parser_getstate(p,&local_450);
    msg("Parse error in %s line %d column %d: %s: %s",path,(ulong)local_450.line,
        (ulong)local_450.col,local_450.msg,parser_error_str[local_450.error]);
    event_signal(EVENT_MESSAGE_FLUSH);
LAB_001e20c0:
    pvVar3 = parser_priv(p);
    lVar4 = 0;
    do {
      if (*(char *)((long)pvVar3 + lVar4 + 0xf5) == '\0') {
        ((uint32_t *)((long)pvVar3 + 0x100))[lVar4] = window_flag[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    _Var1 = !_Var1;
    subwindows_set_flags((uint32_t *)((long)pvVar3 + 0x100),8);
    file_close(f);
    pvVar3 = parser_priv(p);
    mem_free(pvVar3);
    parser_destroy(p);
  }
  return _Var1;
}

Assistant:

static bool process_pref_file_named(const char *path, bool quiet, bool user) {
	ang_file *f = file_open(path, MODE_READ, -1);
	errr e = 0;

	if (!f) {
		if (!quiet)
			msg("Cannot open '%s'.", path);

		e = PARSE_ERROR_INTERNAL; /* signal failure to callers */
	} else {
		char line[1024];
		int line_no = 0;

		struct parser *p = init_parse_prefs(user);
		while (file_getl(f, line, sizeof line)) {
			line_no++;

			e = parser_parse(p, line);
			if (e != PARSE_ERROR_NONE) {
				print_error(path, p);
				break;
			}
		}
		finish_parse_prefs(p);

		file_close(f);
		mem_free(parser_priv(p));
		parser_destroy(p);
	}

	/* Result */
	return e == PARSE_ERROR_NONE;
}